

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  double *pdVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  uint local_38;
  
  piVar3 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
  iVar11 = piVar3[partitionIndex];
  lVar10 = (long)iVar11;
  iVar2 = piVar3[(long)partitionIndex + 1];
  if (iVar11 < iVar2) {
    lVar4 = (this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
    iVar11 = iVar11 * 4;
    do {
      dVar12 = 1.0;
      iVar7 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      if (0 < iVar7) {
        auVar13 = ZEXT816(0);
        iVar8 = iVar7;
        iVar9 = iVar11;
        do {
          auVar15._8_8_ = 0;
          auVar15._0_8_ = destP[iVar9];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = destP[(long)iVar9 + 1];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = destP[(long)iVar9 + 2];
          auVar13 = vmaxsd_avx(auVar15,auVar13);
          auVar13 = vmaxsd_avx(auVar16,auVar13);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = destP[(long)iVar9 + 3];
          iVar9 = iVar9 + (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount * 4;
          iVar8 = iVar8 + -1;
          auVar13 = vmaxsd_avx(auVar19,auVar13);
          auVar13 = vmaxsd_avx(auVar17,auVar13);
        } while (iVar8 != 0);
        uVar5 = vcmpsd_avx512f(auVar13,ZEXT816(0),0);
        bVar6 = (bool)((byte)uVar5 & 1);
        dVar12 = (double)((ulong)bVar6 * 0x3ff0000000000000 + (ulong)!bVar6 * auVar13._0_8_);
        if (0 < iVar7) {
          iVar9 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
          dVar14 = 1.0 / dVar12;
          iVar8 = iVar11;
          do {
            pdVar1 = destP + iVar8;
            auVar18._0_8_ = dVar14 * *pdVar1;
            auVar18._8_8_ = dVar14 * pdVar1[1];
            auVar18._16_8_ = dVar14 * pdVar1[2];
            auVar18._24_8_ = dVar14 * pdVar1[3];
            *(undefined1 (*) [32])(destP + iVar8) = auVar18;
            iVar8 = iVar8 + iVar9 * 4;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      local_38 = (uint)lVar4;
      if ((local_38 >> 10 & 1) == 0) {
        scaleFactors[lVar10] = dVar12;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar12 = log(dVar12);
LAB_00129291:
          cumulativeScaleFactors[lVar10] = dVar12 + cumulativeScaleFactors[lVar10];
        }
      }
      else {
        dVar12 = log(dVar12);
        scaleFactors[lVar10] = dVar12;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_00129291;
      }
      lVar10 = lVar10 + 1;
      iVar11 = iVar11 + 4;
    } while (lVar10 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}